

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::CallNative(SQVM *this,SQNativeClosure *nclosure,SQInteger nargs,SQInteger newbase,
                SQObjectPtr *retval,bool *suspend)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  bool bVar3;
  SQIntVec *this_00;
  SQUnsignedInteger SVar4;
  SQInteger SVar5;
  SQInteger ret;
  SQInteger i_1;
  SQInteger outers;
  SQInteger i;
  SQIntVec *tc;
  SQInteger tcs;
  SQInteger newtop;
  SQInteger nparamscheck;
  bool *suspend_local;
  SQObjectPtr *retval_local;
  SQInteger newbase_local;
  SQInteger nargs_local;
  SQNativeClosure *nclosure_local;
  SQVM *this_local;
  
  lVar1 = nclosure->_nparamscheck;
  SVar2 = nclosure->_noutervalues;
  if (this->_nnativecalls + 1 < 0x65) {
    if ((lVar1 == 0) || (((lVar1 < 1 || (lVar1 == nargs)) && ((-1 < lVar1 || (-lVar1 <= nargs))))))
    {
      this_00 = &nclosure->_typecheck;
      SVar4 = sqvector<long_long>::size(this_00);
      if (SVar4 != 0) {
        for (outers = 0; outers < nargs && outers < (long)SVar4; outers = outers + 1) {
          if ((this_00->_vals[outers] != -1) &&
             (((ulong)(this->_stack)._vals[newbase + outers].super_SQObject._type &
              this_00->_vals[outers]) == 0)) {
            Raise_ParamTypeError
                      (this,outers,this_00->_vals[outers],
                       (ulong)(this->_stack)._vals[newbase + outers].super_SQObject._type);
            return false;
          }
        }
      }
      bVar3 = EnterFrame(this,newbase,newbase + nargs + SVar2,false);
      if (bVar3) {
        ::SQObjectPtr::operator=(&this->ci->_closure,nclosure);
        SVar2 = nclosure->_noutervalues;
        for (ret = 0; ret < (long)SVar2; ret = ret + 1) {
          ::SQObjectPtr::operator=
                    ((this->_stack)._vals + newbase + nargs + ret,nclosure->_outervalues + ret);
        }
        if (nclosure->_env != (SQWeakRef *)0x0) {
          ::SQObjectPtr::operator=((this->_stack)._vals + newbase,&nclosure->_env->_obj);
        }
        this->_nnativecalls = this->_nnativecalls + 1;
        SVar5 = (*nclosure->_function)(this);
        this->_nnativecalls = this->_nnativecalls + -1;
        *suspend = false;
        if (SVar5 == -0x29a) {
          *suspend = true;
        }
        else if (SVar5 < 0) {
          LeaveFrame(this);
          Raise_Error(this,&this->_lasterror);
          return false;
        }
        if (SVar5 == 0) {
          ::SQObjectPtr::Null(retval);
        }
        else {
          ::SQObjectPtr::operator=(retval,(this->_stack)._vals + this->_top + -1);
        }
        LeaveFrame(this);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      Raise_Error(this,"wrong number of parameters");
      this_local._7_1_ = false;
    }
  }
  else {
    Raise_Error(this,"Native stack overflow");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQVM::CallNative(SQNativeClosure *nclosure, SQInteger nargs, SQInteger newbase, SQObjectPtr &retval, bool &suspend)
{
    SQInteger nparamscheck = nclosure->_nparamscheck;
    SQInteger newtop = newbase + nargs + nclosure->_noutervalues;

    if (_nnativecalls + 1 > MAX_NATIVE_CALLS) {
        Raise_Error(_SC("Native stack overflow"));
        return false;
    }

    if(nparamscheck && (((nparamscheck > 0) && (nparamscheck != nargs)) ||
        ((nparamscheck < 0) && (nargs < (-nparamscheck)))))
    {
        Raise_Error(_SC("wrong number of parameters"));
        return false;
    }

    SQInteger tcs;
    SQIntVec &tc = nclosure->_typecheck;
    if((tcs = tc.size())) {
        for(SQInteger i = 0; i < nargs && i < tcs; i++) {
            if((tc._vals[i] != -1) && !(type(_stack._vals[newbase+i]) & tc._vals[i])) {
                Raise_ParamTypeError(i,tc._vals[i],type(_stack._vals[newbase+i]));
                return false;
            }
        }
    }

    if(!EnterFrame(newbase, newtop, false)) return false;
    ci->_closure  = nclosure;

    SQInteger outers = nclosure->_noutervalues;
    for (SQInteger i = 0; i < outers; i++) {
        _stack._vals[newbase+nargs+i] = nclosure->_outervalues[i];
    }
    if(nclosure->_env) {
        _stack._vals[newbase] = nclosure->_env->_obj;
    }

    _nnativecalls++;
    SQInteger ret = (nclosure->_function)(this);
    _nnativecalls--;

    suspend = false;
    if (ret == SQ_SUSPEND_FLAG) {
        suspend = true;
    }
    else if (ret < 0) {
        LeaveFrame();
        Raise_Error(_lasterror);
        return false;
    }
    if(ret) {
        retval = _stack._vals[_top-1];
    }
    else {
        retval.Null();
    }
    //retval = ret ? _stack._vals[_top-1] : _null_;
    LeaveFrame();
    return true;
}